

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuilderTask.cpp
# Opt level: O0

void __thiscall
nigel::BuilderTask::BuilderTask
          (BuilderTask *this,String *name,String *description,String *helpText,
          list<std::shared_ptr<nigel::BuilderExecutable>,_std::allocator<std::shared_ptr<nigel::BuilderExecutable>_>_>
          *executables)

{
  mapped_type *pmVar1;
  key_type local_1a4 [93];
  list<std::shared_ptr<nigel::BuilderExecutable>,_std::allocator<std::shared_ptr<nigel::BuilderExecutable>_>_>
  *local_30;
  list<std::shared_ptr<nigel::BuilderExecutable>,_std::allocator<std::shared_ptr<nigel::BuilderExecutable>_>_>
  *executables_local;
  String *helpText_local;
  String *description_local;
  String *name_local;
  BuilderTask *this_local;
  
  this->_vptr_BuilderTask = (_func_int **)&PTR__BuilderTask_002b60c8;
  local_30 = executables;
  executables_local =
       (list<std::shared_ptr<nigel::BuilderExecutable>,_std::allocator<std::shared_ptr<nigel::BuilderExecutable>_>_>
        *)helpText;
  helpText_local = description;
  description_local = name;
  name_local = (String *)this;
  std::__cxx11::string::string((string *)&this->name);
  std::__cxx11::string::string((string *)&this->description);
  std::__cxx11::string::string((string *)&this->helpText);
  std::__cxx11::
  list<std::shared_ptr<nigel::BuilderExecutable>,_std::allocator<std::shared_ptr<nigel::BuilderExecutable>_>_>
  ::list(&this->executables);
  std::
  map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&this->notificationTexts);
  std::__cxx11::string::operator=((string *)&this->name,(string *)name);
  std::__cxx11::string::operator=((string *)&this->description,(string *)description);
  std::__cxx11::string::operator=((string *)&this->helpText,(string *)helpText);
  std::__cxx11::
  list<std::shared_ptr<nigel::BuilderExecutable>,_std::allocator<std::shared_ptr<nigel::BuilderExecutable>_>_>
  ::operator=(&this->executables,executables);
  local_1a4[0x59] = 1;
  pmVar1 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->notificationTexts,local_1a4 + 0x59);
  std::__cxx11::string::operator=((string *)pmVar1,"An ifdef or ifndef is never closed.");
  local_1a4[0x58] = 2;
  pmVar1 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->notificationTexts,local_1a4 + 0x58);
  std::__cxx11::string::operator=((string *)pmVar1,"Found elseif without prior ifdef/ifndef.");
  local_1a4[0x57] = 3;
  pmVar1 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->notificationTexts,local_1a4 + 0x57);
  std::__cxx11::string::operator=((string *)pmVar1,"Found endif without prior ifdef/ifndef.");
  local_1a4[0x56] = 4;
  pmVar1 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->notificationTexts,local_1a4 + 0x56);
  std::__cxx11::string::operator=
            ((string *)pmVar1,
             "Incomplete define-directive found. Use \'#define <identifier> [definition]\'.");
  local_1a4[0x55] = 5;
  pmVar1 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->notificationTexts,local_1a4 + 0x55);
  std::__cxx11::string::operator=
            ((string *)pmVar1,"Incomplete undef-directive found. Use \'#undef <identifier>\'.");
  local_1a4[0x54] = 6;
  pmVar1 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->notificationTexts,local_1a4 + 0x54);
  std::__cxx11::string::operator=
            ((string *)pmVar1,"Incomplete ifdef-directive found. Use \'#ifdef <identifier>\'.");
  local_1a4[0x53] = 7;
  pmVar1 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->notificationTexts,local_1a4 + 0x53);
  std::__cxx11::string::operator=
            ((string *)pmVar1,"Incomplete ifndef-directive found. Use \'#ifndef <identifier>\'.");
  local_1a4[0x52] = 8;
  pmVar1 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->notificationTexts,local_1a4 + 0x52);
  std::__cxx11::string::operator=
            ((string *)pmVar1,
             "Incomplete include-directive found. Use \'#include \"<path_to_file>\"\'.");
  local_1a4[0x51] = 9;
  pmVar1 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->notificationTexts,local_1a4 + 0x51);
  std::__cxx11::string::operator=
            ((string *)pmVar1,
             "Incomplete pragma-directive found. Use \'#pragma <command> [parameter [...]]\'.");
  local_1a4[0x50] = 10;
  pmVar1 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->notificationTexts,local_1a4 + 0x50);
  std::__cxx11::string::operator=
            ((string *)pmVar1,
             "Incomplete memmodel pragma-directive found. Use \'#pragma memmodel <model>\'.");
  local_1a4[0x4f] = 0xb;
  pmVar1 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->notificationTexts,local_1a4 + 0x4f);
  std::__cxx11::string::operator=
            ((string *)pmVar1,"Unknown memory model defined in pragma. Use fast or large");
  local_1a4[0x4e] = 0xc;
  pmVar1 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->notificationTexts,local_1a4 + 0x4e);
  std::__cxx11::string::operator=((string *)pmVar1,"Unknown pragma found.");
  local_1a4[0x4d] = 0xd;
  pmVar1 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->notificationTexts,local_1a4 + 0x4d);
  std::__cxx11::string::operator=((string *)pmVar1,"Unknown preprocessor directive found.");
  local_1a4[0x4c] = 0xe;
  pmVar1 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->notificationTexts,local_1a4 + 0x4c);
  std::__cxx11::string::operator=((string *)pmVar1,"error directive");
  local_1a4[0x4b] = 0xf;
  pmVar1 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->notificationTexts,local_1a4 + 0x4b);
  std::__cxx11::string::operator=
            ((string *)pmVar1,"Reached end of file with unfinished expression.");
  local_1a4[0x4a] = 0x10;
  pmVar1 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->notificationTexts,local_1a4 + 0x4a);
  std::__cxx11::string::operator=
            ((string *)pmVar1,"Unexpectd token found. What did you tend to achive with this token?")
  ;
  local_1a4[0x49] = 0x11;
  pmVar1 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->notificationTexts,local_1a4 + 0x49);
  std::__cxx11::string::operator=((string *)pmVar1,"An identifier was expected.");
  local_1a4[0x48] = 0x12;
  pmVar1 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->notificationTexts,local_1a4 + 0x48);
  std::__cxx11::string::operator=
            ((string *)pmVar1,"Expected expression or value at a variable allocation.");
  local_1a4[0x47] = 0x13;
  pmVar1 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->notificationTexts,local_1a4 + 0x47);
  std::__cxx11::string::operator=((string *)pmVar1,"Expected \'=\' at allocation.");
  local_1a4[0x46] = 0x14;
  pmVar1 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->notificationTexts,local_1a4 + 0x46);
  std::__cxx11::string::operator=((string *)pmVar1,"Expected known literal.");
  local_1a4[0x45] = 0x15;
  pmVar1 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->notificationTexts,local_1a4 + 0x45);
  std::__cxx11::string::operator=((string *)pmVar1,"The variable identifier is already defined.");
  local_1a4[0x44] = 0x16;
  pmVar1 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->notificationTexts,local_1a4 + 0x44);
  std::__cxx11::string::operator=((string *)pmVar1,"This identifier is not defined.");
  local_1a4[0x43] = 0x17;
  pmVar1 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->notificationTexts,local_1a4 + 0x43);
  std::__cxx11::string::operator=((string *)pmVar1,"Expected allocation after attribute keyword.");
  local_1a4[0x42] = 0x18;
  pmVar1 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->notificationTexts,local_1a4 + 0x42);
  std::__cxx11::string::operator=((string *)pmVar1,"Unexpected returnable before byte keyword.");
  local_1a4[0x41] = 0x19;
  pmVar1 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->notificationTexts,local_1a4 + 0x41);
  std::__cxx11::string::operator=((string *)pmVar1,"Unexpected returnable before fast keyword.");
  local_1a4[0x40] = 0x1a;
  pmVar1 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->notificationTexts,local_1a4 + 0x40);
  std::__cxx11::string::operator=((string *)pmVar1,"Unexpected returnable before norm keyword.");
  local_1a4[0x3f] = 0x1b;
  pmVar1 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->notificationTexts,local_1a4 + 0x3f);
  std::__cxx11::string::operator=((string *)pmVar1,"Unexpected returnable before unsigned keyword.")
  ;
  local_1a4[0x3e] = 0x1c;
  pmVar1 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->notificationTexts,local_1a4 + 0x3e);
  std::__cxx11::string::operator=((string *)pmVar1,"Unexpected returnable before identifier.");
  local_1a4[0x3d] = 0x1d;
  pmVar1 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->notificationTexts,local_1a4 + 0x3d);
  std::__cxx11::string::operator=((string *)pmVar1,"Unexpected returnable before literal.");
  local_1a4[0x3c] = 0x1e;
  pmVar1 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->notificationTexts,local_1a4 + 0x3c);
  std::__cxx11::string::operator=
            ((string *)pmVar1,"Unexpected returnable before parenthesis block.");
  local_1a4[0x3b] = 0x1f;
  pmVar1 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->notificationTexts,local_1a4 + 0x3b);
  std::__cxx11::string::operator=((string *)pmVar1,"Unexpected returnable before block.");
  local_1a4[0x3a] = 0x20;
  pmVar1 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->notificationTexts,local_1a4 + 0x3a);
  std::__cxx11::string::operator=((string *)pmVar1,"Unexpected returnable before function.");
  local_1a4[0x39] = 0x21;
  pmVar1 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->notificationTexts,local_1a4 + 0x39);
  std::__cxx11::string::operator=((string *)pmVar1,"Exptected Identifiern before operation.");
  local_1a4[0x38] = 0x22;
  pmVar1 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->notificationTexts,local_1a4 + 0x38);
  std::__cxx11::string::operator=((string *)pmVar1,"Exptected Identifiern after operation.");
  local_1a4[0x37] = 0x23;
  pmVar1 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->notificationTexts,local_1a4 + 0x37);
  std::__cxx11::string::operator=
            ((string *)pmVar1,"Expected expression or value as rValue at operation.");
  local_1a4[0x36] = 0x24;
  pmVar1 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->notificationTexts,local_1a4 + 0x36);
  std::__cxx11::string::operator=((string *)pmVar1,"Found unmatching type at Operation.");
  local_1a4[0x35] = 0x25;
  pmVar1 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->notificationTexts,local_1a4 + 0x35);
  std::__cxx11::string::operator=((string *)pmVar1,"Unknown binary operator.");
  local_1a4[0x34] = 0x26;
  pmVar1 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->notificationTexts,local_1a4 + 0x34);
  std::__cxx11::string::operator=((string *)pmVar1,"Unknown unary operator.");
  local_1a4[0x33] = 0x27;
  pmVar1 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->notificationTexts,local_1a4 + 0x33);
  std::__cxx11::string::operator=
            ((string *)pmVar1,"Cannot set a constant literal or term. Did you mean \'==\'?");
  local_1a4[0x32] = 0x28;
  pmVar1 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->notificationTexts,local_1a4 + 0x32);
  std::__cxx11::string::operator=
            ((string *)pmVar1,
             "Only positive constants are allowed for binary shifts, due to processor limitations.")
  ;
  local_1a4[0x31] = 0x29;
  pmVar1 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->notificationTexts,local_1a4 + 0x31);
  std::__cxx11::string::operator=
            ((string *)pmVar1,
             "Only positive constants are allowed for binary shifts. Use the opperation antagonist instead."
            );
  local_1a4[0x30] = 0x2a;
  pmVar1 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->notificationTexts,local_1a4 + 0x30);
  std::__cxx11::string::operator=
            ((string *)pmVar1,"Cannot set a constant literal or term with the operation result.");
  local_1a4[0x2f] = 0x2b;
  pmVar1 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->notificationTexts,local_1a4 + 0x2f);
  std::__cxx11::string::operator=((string *)pmVar1,"Unexpected identifier in parenthesis block.");
  local_1a4[0x2e] = 0x2c;
  pmVar1 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->notificationTexts,local_1a4 + 0x2e);
  std::__cxx11::string::operator=((string *)pmVar1,"Expected returnable in parenthesis block.");
  local_1a4[0x2d] = 0x2e;
  pmVar1 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->notificationTexts,local_1a4 + 0x2d);
  std::__cxx11::string::operator=((string *)pmVar1,"Unexpected literal in parenthesis block.");
  local_1a4[0x2c] = 0x2f;
  pmVar1 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->notificationTexts,local_1a4 + 0x2c);
  std::__cxx11::string::operator=((string *)pmVar1,"Unexpected identifier in parenthesis block.");
  local_1a4[0x2b] = 0x30;
  pmVar1 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->notificationTexts,local_1a4 + 0x2b);
  std::__cxx11::string::operator=
            ((string *)pmVar1,"Expected term after returnable in parenthesis block.");
  local_1a4[0x2a] = 0x31;
  pmVar1 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->notificationTexts,local_1a4 + 0x2a);
  std::__cxx11::string::operator=((string *)pmVar1,"Unexpected closing of parenthesis block.");
  local_1a4[0x29] = 0x32;
  pmVar1 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->notificationTexts,local_1a4 + 0x29);
  std::__cxx11::string::operator=((string *)pmVar1,"A parenthesis block was not closed.");
  local_1a4[0x28] = 0x33;
  pmVar1 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->notificationTexts,local_1a4 + 0x28);
  std::__cxx11::string::operator=((string *)pmVar1,"Unexpected closing of block.");
  local_1a4[0x27] = 0x34;
  pmVar1 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->notificationTexts,local_1a4 + 0x27);
  std::__cxx11::string::operator=((string *)pmVar1,"A block was not closed.");
  local_1a4[0x26] = 0x35;
  pmVar1 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->notificationTexts,local_1a4 + 0x26);
  std::__cxx11::string::operator=((string *)pmVar1,"Expect parenthesis after if keyword.");
  local_1a4[0x25] = 0x37;
  pmVar1 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->notificationTexts,local_1a4 + 0x25);
  std::__cxx11::string::operator=((string *)pmVar1,"Expect block after if statement.");
  local_1a4[0x24] = 0x38;
  pmVar1 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->notificationTexts,local_1a4 + 0x24);
  std::__cxx11::string::operator=((string *)pmVar1,"Expect block after else statement.");
  local_1a4[0x23] = 0x39;
  pmVar1 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->notificationTexts,local_1a4 + 0x23);
  std::__cxx11::string::operator=
            ((string *)pmVar1,"Expected boolean expression or value as rValue at operation.");
  local_1a4[0x22] = 0x3a;
  pmVar1 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->notificationTexts,local_1a4 + 0x22);
  std::__cxx11::string::operator=((string *)pmVar1,"Expect parenthesis after while statement.");
  local_1a4[0x21] = 0x3b;
  pmVar1 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->notificationTexts,local_1a4 + 0x21);
  std::__cxx11::string::operator=((string *)pmVar1,"Expect block after while statement.");
  local_1a4[0x20] = 0x3c;
  pmVar1 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->notificationTexts,local_1a4 + 0x20);
  std::__cxx11::string::operator=
            ((string *)pmVar1,"A comparison condition cannot be the rValue of this expressions.");
  local_1a4[0x1f] = 0x3d;
  pmVar1 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->notificationTexts,local_1a4 + 0x1f);
  std::__cxx11::string::operator=((string *)pmVar1,"Unexpected identifier before \'not\' operator.")
  ;
  local_1a4[0x1e] = 0x3e;
  pmVar1 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->notificationTexts,local_1a4 + 0x1e);
  std::__cxx11::string::operator=((string *)pmVar1,"Operations can\'t be done in the global scope.")
  ;
  local_1a4[0x1d] = 0x3f;
  pmVar1 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->notificationTexts,local_1a4 + 0x1d);
  std::__cxx11::string::operator=
            ((string *)pmVar1,"Functions can\'t be defined in the local scope.");
  local_1a4[0x1c] = 0x40;
  pmVar1 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->notificationTexts,local_1a4 + 0x1c);
  std::__cxx11::string::operator=((string *)pmVar1,"Unknown type at function deklaration.");
  local_1a4[0x1b] = 0x41;
  pmVar1 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->notificationTexts,local_1a4 + 0x1b);
  std::__cxx11::string::operator=((string *)pmVar1,"Expected identifier at function deklaration.");
  local_1a4[0x1a] = 0x42;
  pmVar1 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->notificationTexts,local_1a4 + 0x1a);
  std::__cxx11::string::operator=
            ((string *)pmVar1,"Expected opening parenthesis at function deklaration.");
  local_1a4[0x19] = 0x43;
  pmVar1 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->notificationTexts,local_1a4 + 0x19);
  std::__cxx11::string::operator=((string *)pmVar1,"Unknown type at function parameter.");
  local_1a4[0x18] = 0x44;
  pmVar1 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->notificationTexts,local_1a4 + 0x18);
  std::__cxx11::string::operator=((string *)pmVar1,"Unknown token after function parameter.");
  local_1a4[0x17] = 0x45;
  pmVar1 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->notificationTexts,local_1a4 + 0x17);
  std::__cxx11::string::operator=((string *)pmVar1,"Expected block after function head.");
  local_1a4[0x16] = 0x46;
  pmVar1 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->notificationTexts,local_1a4 + 0x16);
  std::__cxx11::string::operator=((string *)pmVar1,"This identifier was already assigned.");
  local_1a4[0x15] = 0x47;
  pmVar1 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->notificationTexts,local_1a4 + 0x15);
  std::__cxx11::string::operator=((string *)pmVar1,"Expected retunable at function call.");
  local_1a4[0x14] = 0x48;
  pmVar1 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->notificationTexts,local_1a4 + 0x14);
  std::__cxx11::string::operator=((string *)pmVar1,"Expected opening parenthesis at function call.")
  ;
  local_1a4[0x13] = 0x49;
  pmVar1 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->notificationTexts,local_1a4 + 0x13);
  std::__cxx11::string::operator=((string *)pmVar1,"Unknown type at function call parameter.");
  local_1a4[0x12] = 0x4a;
  pmVar1 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->notificationTexts,local_1a4 + 0x12);
  std::__cxx11::string::operator=((string *)pmVar1,"Expected retunable at return statement.");
  local_1a4[0x11] = 0x4b;
  pmVar1 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->notificationTexts,local_1a4 + 0x11);
  std::__cxx11::string::operator=
            ((string *)pmVar1,"The return statement has to be in the outer scope of a function.");
  local_1a4[0x10] = 0x4c;
  pmVar1 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->notificationTexts,local_1a4 + 0x10);
  std::__cxx11::string::operator=
            ((string *)pmVar1,
             "Did not found a matching function for this call. The parameter types do not match.");
  local_1a4[0xf] = 0x4d;
  pmVar1 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->notificationTexts,local_1a4 + 0xf);
  std::__cxx11::string::operator=((string *)pmVar1,"Expected variable to refer to.");
  local_1a4[0xe] = 0x4e;
  pmVar1 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->notificationTexts,local_1a4 + 0xe);
  std::__cxx11::string::operator=((string *)pmVar1,"Expected pointer to dereference.");
  local_1a4[0xd] = 0x4f;
  pmVar1 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->notificationTexts,local_1a4 + 0xd);
  std::__cxx11::string::operator=
            ((string *)pmVar1,
             "Can\'t get the address of a large global. User the attribute \'fast\' in the variable declaration."
            );
  local_1a4[0xc] = 0x50;
  pmVar1 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->notificationTexts,local_1a4 + 0xc);
  std::__cxx11::string::operator=((string *)pmVar1,"Unknown expression found.");
  local_1a4[0xb] = 0x51;
  pmVar1 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->notificationTexts,local_1a4 + 0xb);
  std::__cxx11::string::operator=((string *)pmVar1,"Can\'t break out of this or outer scope.");
  local_1a4[10] = 0x52;
  pmVar1 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->notificationTexts,local_1a4 + 10);
  std::__cxx11::string::operator=((string *)pmVar1,"Internal error: block was not found.");
  local_1a4[9] = 0x53;
  pmVar1 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->notificationTexts,local_1a4 + 9);
  std::__cxx11::string::operator=((string *)pmVar1,"Internal error: condition was not found.");
  local_1a4[8] = 0x54;
  pmVar1 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->notificationTexts,local_1a4 + 8);
  std::__cxx11::string::operator=((string *)pmVar1,"Function definition was not found.");
  local_1a4[7] = 0x55;
  pmVar1 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->notificationTexts,local_1a4 + 7);
  std::__cxx11::string::operator=
            ((string *)pmVar1,"Main entry point not found! Please define the main function.");
  local_1a4[6] = 0x56;
  pmVar1 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->notificationTexts,local_1a4 + 6);
  std::__cxx11::string::operator=((string *)pmVar1,"This symbol is already defined.");
  local_1a4[5] = 0x8000;
  pmVar1 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->notificationTexts,local_1a4 + 5);
  std::__cxx11::string::operator=((string *)pmVar1,"waring directive.");
  local_1a4[4] = 0x8001;
  pmVar1 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->notificationTexts,local_1a4 + 4);
  std::__cxx11::string::operator=
            ((string *)pmVar1,"Preprocessor directive is empty. You can safely remove this line.");
  local_1a4[3] = 0x8002;
  pmVar1 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->notificationTexts,local_1a4 + 3);
  std::__cxx11::string::operator=((string *)pmVar1,"Undef directive used for undefined identifier.")
  ;
  local_1a4[2] = 0x8003;
  pmVar1 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->notificationTexts,local_1a4 + 2);
  std::__cxx11::string::operator=
            ((string *)pmVar1,
             "To many variables were declared for fast memory. All other variables will be saved in normal memory."
            );
  local_1a4[1] = 0x10000;
  pmVar1 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->notificationTexts,local_1a4 + 1);
  std::__cxx11::string::operator=
            ((string *)pmVar1,
             "The operation is obsolete and could be replaced by a single constant.");
  local_1a4[0] = imp_operationOnConstantCanBePrevented;
  pmVar1 = std::
           map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->notificationTexts,local_1a4);
  std::__cxx11::string::operator=
            ((string *)pmVar1,
             "The operation is obsolete and could be replaced by a single constant.");
  return;
}

Assistant:

BuilderTask::BuilderTask( String name, String description, String helpText, std::list<std::shared_ptr<BuilderExecutable>> executables )
	{
		this->name = name;
		this->description = description;
		this->helpText = helpText;
		this->executables = executables;

		//Load notification texts
		notificationTexts[NT::err_unclosedIfdef] = "An ifdef or ifndef is never closed.";
		notificationTexts[NT::err_elseifWithoutIfdef] = "Found elseif without prior ifdef/ifndef.";
		notificationTexts[NT::err_endifWithoutIfdef] = "Found endif without prior ifdef/ifndef.";
		notificationTexts[NT::err_incompleteDefineDirective] = "Incomplete define-directive found. Use '#define <identifier> [definition]'.";
		notificationTexts[NT::err_incompleteUndefineDirective] = "Incomplete undef-directive found. Use '#undef <identifier>'.";
		notificationTexts[NT::err_incompleteIfdefDirective] = "Incomplete ifdef-directive found. Use '#ifdef <identifier>'.";
		notificationTexts[NT::err_incompleteIfndefDirective] = "Incomplete ifndef-directive found. Use '#ifndef <identifier>'.";
		notificationTexts[NT::err_incompleteIncludeDirective] = "Incomplete include-directive found. Use '#include \"<path_to_file>\"'.";
		notificationTexts[NT::err_incompletePragma] = "Incomplete pragma-directive found. Use '#pragma <command> [parameter [...]]'.";
		notificationTexts[NT::err_incompleteMemModelPragma] = "Incomplete memmodel pragma-directive found. Use '#pragma memmodel <model>'.";
		notificationTexts[NT::err_unknownMemModelPragma] = "Unknown memory model defined in pragma. Use fast or large";
		notificationTexts[NT::err_unknownPragma] = "Unknown pragma found.";
		notificationTexts[NT::err_unknownDirective] = "Unknown preprocessor directive found.";
		notificationTexts[NT::err_errorDirective] = "error directive";

		notificationTexts[NT::err_reachedEOF_unfinishedExpression] = "Reached end of file with unfinished expression.";
		notificationTexts[NT::err_unexpectedToken] = "Unexpectd token found. What did you tend to achive with this token?";
		notificationTexts[NT::err_expectedIdentifier_atAllocation] = "An identifier was expected.";
		notificationTexts[NT::err_expectedExprWithReturnValue_atAllocation] = "Expected expression or value at a variable allocation.";
		notificationTexts[NT::err_expectedEqlSign_atAllocation] = "Expected '=' at allocation.";
		notificationTexts[NT::err_expectedKnownLiteral] = "Expected known literal.";
		notificationTexts[NT::err_variableAlreadyDefined] = "The variable identifier is already defined.";
		notificationTexts[NT::err_undefinedIdentifier] = "This identifier is not defined.";
		notificationTexts[NT::err_noAllocationAfterVariableAttribute] = "Expected allocation after attribute keyword.";

		notificationTexts[NT::err_unexpectedReturningBeforeByteKeyword] = "Unexpected returnable before byte keyword.";
		notificationTexts[NT::err_unexpectedReturningBeforeFastKeyword] = "Unexpected returnable before fast keyword.";
		notificationTexts[NT::err_unexpectedReturningBeforeNormKeyword] = "Unexpected returnable before norm keyword.";
		notificationTexts[NT::err_unexpectedReturningBeforeUnsignedKeyword] = "Unexpected returnable before unsigned keyword.";
		notificationTexts[NT::err_unexpectedReturningBeforeIdentifier] = "Unexpected returnable before identifier.";
		notificationTexts[NT::err_unexpectedReturningBeforeLiteral] = "Unexpected returnable before literal.";
		notificationTexts[NT::err_unexpectedReturningBeforeParenthesisBlock] = "Unexpected returnable before parenthesis block.";
		notificationTexts[NT::err_unexpectedReturningBeforeBlock] = "Unexpected returnable before block.";
		notificationTexts[NT::err_unexpectedReturningBeforeFunctionDeklaration] = "Unexpected returnable before function.";
		notificationTexts[NT::err_expectedIdentifierBeforeOperator] = "Exptected Identifiern before operation.";
		notificationTexts[NT::err_expectedIdentifierAfterOperator] = "Exptected Identifiern after operation.";
		notificationTexts[NT::err_expectedExprWithReturnValue_atOperation] = "Expected expression or value as rValue at operation.";
		notificationTexts[NT::err_unmatchingTypeFound_atTerm] = "Found unmatching type at Operation.";
		notificationTexts[NT::err_unknownBinaryOperator] = "Unknown binary operator.";
		notificationTexts[NT::err_unknownUnaryOperator] = "Unknown unary operator.";

		notificationTexts[NT::err_cannotSetAConstantLiteral] = "Cannot set a constant literal or term. Did you mean '=='?";
		notificationTexts[NT::err_onlyConstantsAreAllowedForBitShifts] = "Only positive constants are allowed for binary shifts, due to processor limitations.";
		notificationTexts[NT::err_onlyPositiveConstantsAreAllowedForBitShifts] = "Only positive constants are allowed for binary shifts. Use the opperation antagonist instead.";
		notificationTexts[NT::err_cannotSetAConstantLiteralInCombinedOperationSet] = "Cannot set a constant literal or term with the operation result.";


		notificationTexts[NT::err_expectedIdentifierInParenthesis] = "Unexpected identifier in parenthesis block.";
		notificationTexts[NT::err_expectedExprWithReturnValue_atParenthesis] = "Expected returnable in parenthesis block.";
		notificationTexts[NT::err_unexpectedLiteralInParenthesis] = "Unexpected literal in parenthesis block.";
		notificationTexts[NT::err_unexpectedIdentifierInParenthesis] = "Unexpected identifier in parenthesis block.";
		notificationTexts[NT::err_expectedTermAfterReturnableInParenthesis] = "Expected term after returnable in parenthesis block.";
		notificationTexts[NT::err_unexpectedCloseOfParenthesis] = "Unexpected closing of parenthesis block.";
		notificationTexts[NT::err_aParenthesisWasNotClosed] = "A parenthesis block was not closed.";

		notificationTexts[NT::err_unexpectedCloseOfBlock] = "Unexpected closing of block.";
		notificationTexts[NT::err_aBlockWasNotClosed] = "A block was not closed.";

		notificationTexts[NT::err_expectParenthesisAfterIfKeyword] = "Expect parenthesis after if keyword.";
		notificationTexts[NT::err_expectBlockAfterIf] = "Expect block after if statement.";
		notificationTexts[NT::err_expectBlockAfterElse] = "Expect block after else statement.";

		notificationTexts[NT::err_expectedExprWithConditionalValue_atOperation] = "Expected boolean expression or value as rValue at operation.";

		notificationTexts[NT::err_expectParenthesisAfterWhileKeyword] = "Expect parenthesis after while statement.";
		notificationTexts[NT::err_expectBlockAfterWhile] = "Expect block after while statement.";
		notificationTexts[NT::err_comparisonConditionCannotBeThisRValue] = "A comparison condition cannot be the rValue of this expressions.";
		notificationTexts[NT::err_unexpectedIdentifierBeforeNotOperator] = "Unexpected identifier before 'not' operator.";

		notificationTexts[NT::err_operationsAreNotAllowedInGlobalScope] = "Operations can't be done in the global scope.";
		notificationTexts[NT::err_functionDefinitionsAreNotAllowedInLocalScope] = "Functions can't be defined in the local scope.";

		notificationTexts[NT::err_unknownTypeAtFunction] = "Unknown type at function deklaration.";
		notificationTexts[NT::err_expectedIdentifier_atFunction] = "Expected identifier at function deklaration.";
		notificationTexts[NT::err_expectedOpeningParenthesis_atFunction] = "Expected opening parenthesis at function deklaration.";
		notificationTexts[NT::err_unknownTypeAtFunctionParameter] = "Unknown type at function parameter.";
		notificationTexts[NT::err_unknownTokenAfterFunctionParameter] = "Unknown token after function parameter.";
		notificationTexts[NT::err_expectedBlockAfterFunctionHead] = "Expected block after function head.";
		notificationTexts[NT::err_functionIdentifierAlreadyAssigned] = "This identifier was already assigned.";
		notificationTexts[NT::err_expectedReturningExpression_atFunctionCall] = "Expected retunable at function call.";
		notificationTexts[NT::err_expectedOpeningParenthesis_atFunctionCall] = "Expected opening parenthesis at function call.";
		notificationTexts[NT::err_unknownTypeAtFunctionCallParameter] = "Unknown type at function call parameter.";
		notificationTexts[NT::err_expectedReturningExpression_AtReturn] = "Expected retunable at return statement.";
		notificationTexts[NT::err_returnHasToBeInTheOuterScope] = "The return statement has to be in the outer scope of a function.";
		notificationTexts[NT::err_notFoundMatchingFunctionDeclaration] = "Did not found a matching function for this call. The parameter types do not match.";

		notificationTexts[NT::err_expectedVariableForReference] = "Expected variable to refer to.";
		notificationTexts[NT::err_expectedVariableForDeferencing] = "Expected pointer to dereference.";
		notificationTexts[NT::err_cannotGetRefOfLargeGlobal] = "Can't get the address of a large global. User the attribute 'fast' in the variable declaration.";

		notificationTexts[NT::err_unknownASTExpr] = "Unknown expression found.";
		notificationTexts[NT::err_cannotBreakAtThisPosition] = "Can't break out of this or outer scope.";

		notificationTexts[NT::err_internal_blockNotFound] = "Internal error: block was not found.";
		notificationTexts[NT::err_internal_conditionalNotFound] = "Internal error: condition was not found.";
		notificationTexts[NT::err_functionDefinitionNotFound] = "Function definition was not found.";
		notificationTexts[NT::err_mainEntryPointNotFound] = "Main entry point not found! Please define the main function.";
		notificationTexts[NT::err_symbolIsAlreadyDefined] = "This symbol is already defined.";


		notificationTexts[NT::warn_warningDirective] = "waring directive.";
		notificationTexts[NT::warn_emptyDirective] = "Preprocessor directive is empty. You can safely remove this line.";
		notificationTexts[NT::warn_undefinedIdentifiernAtUndefDirective] = "Undef directive used for undefined identifier.";

		notificationTexts[NT::warn_toManyVariablesInFastRAM] = "To many variables were declared for fast memory. All other variables will be saved in normal memory.";


		notificationTexts[NT::imp_operationOnTwoConstantsCanBePrevented] = "The operation is obsolete and could be replaced by a single constant.";
		notificationTexts[NT::imp_operationOnConstantCanBePrevented] = "The operation is obsolete and could be replaced by a single constant.";

	}